

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_status(int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  int iVar1;
  long in_FS_OFFSET;
  sqlite3_int64 iHwtr;
  sqlite3_int64 iCur;
  sqlite3_int64 local_28;
  sqlite3_int64 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0;
  local_28 = 0;
  iVar1 = sqlite3_status64(op,&local_20,&local_28,resetFlag);
  if (iVar1 == 0) {
    *pCurrent = (int)local_20;
    *pHighwater = (int)local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API int sqlite3_status(int op, int *pCurrent, int *pHighwater, int resetFlag){
  sqlite3_int64 iCur = 0, iHwtr = 0;
  int rc;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCurrent==0 || pHighwater==0 ) return SQLITE_MISUSE_BKPT;
#endif
  rc = sqlite3_status64(op, &iCur, &iHwtr, resetFlag);
  if( rc==0 ){
    *pCurrent = (int)iCur;
    *pHighwater = (int)iHwtr;
  }
  return rc;
}